

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateLookupByKey
          (KotlinKMPGenerator *this,FieldDef *key_field,StructDef *struct_def,CodeWriter *writer,
          IDLOptions *options)

{
  IdlNamer *pIVar1;
  CodeWriter *writer_00;
  ostream *poVar2;
  anon_class_32_4_5c0e32c5 statements;
  stringstream params;
  allocator<char> local_291;
  undefined1 local_290 [32];
  IDLOptions *local_270;
  CodeWriter *local_268;
  FieldDef *local_260;
  function<void_()> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_270 = options;
  local_268 = writer;
  local_260 = key_field;
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,"obj: ");
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_290,pIVar1,struct_def);
  poVar2 = std::operator<<(poVar2,(string *)local_290);
  poVar2 = std::operator<<(poVar2,"?");
  std::operator<<(poVar2,", ");
  std::__cxx11::string::~string((string *)local_290);
  std::operator<<(local_1a8,"vectorLocation: Int, ");
  poVar2 = std::operator<<(local_1a8,"key: ");
  GenTypeGet_abi_cxx11_((string *)local_290,this,&(key_field->value).type);
  poVar2 = std::operator<<(poVar2,(string *)local_290);
  std::operator<<(poVar2,", ");
  std::__cxx11::string::~string((string *)local_290);
  std::operator<<(local_1a8,"bb: ReadWriteBuffer");
  writer_00 = local_268;
  local_290._0_8_ = &local_260;
  local_290._8_8_ = local_268;
  local_290._16_8_ = this;
  local_290._24_8_ = struct_def;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"lookupByKey",&local_291);
  std::__cxx11::stringbuf::str();
  (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_238,pIVar1,struct_def);
  std::operator+(&local_218,&local_238,"?");
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateLookupByKey(flatbuffers::FieldDef*,flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_&,void>
            ((function<void()> *)&local_258,(anon_class_32_4_5c0e32c5 *)local_290);
  GenerateFun(writer_00,&local_1d8,&local_1f8,&local_218,&local_258,local_270->gen_jvmstatic);
  std::_Function_base::~_Function_base(&local_258.super__Function_base);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void GenerateLookupByKey(FieldDef *key_field, StructDef &struct_def,
                           CodeWriter &writer, const IDLOptions options) const {
    std::stringstream params;
    params << "obj: " << namer_.Type(struct_def) << "?"
           << ", ";
    params << "vectorLocation: Int, ";
    params << "key: " << GenTypeGet(key_field->value.type) << ", ";
    params << "bb: ReadWriteBuffer";

    auto statements = [&]() {
      auto base_type = key_field->value.type.base_type;
      writer.SetValue("struct_name", namer_.Type(struct_def));
      if (base_type == BASE_TYPE_STRING) {
        writer += "val byteKey = key.encodeToByteArray()";
      }
      writer += "var span = bb.getInt(vectorLocation - 4)";
      writer += "var start = 0";
      writer += "while (span != 0) {";
      writer.IncrementIdentLevel();
      writer += "var middle = span / 2";
      writer +=
          "val tableOffset = indirect(vector"
          "Location + 4 * (start + middle), bb)";
      if (IsString(key_field->value.type)) {
        writer += "val comp = compareStrings(\\";
        writer += GenOffsetGetter(key_field) + "\\";
        writer += ", byteKey, bb)";
      } else {
        auto get_val = GenLookupByKey(key_field, "bb");
        writer += "val value = " + get_val;
        writer += "val comp = value.compareTo(key)";
      }
      writer += "when {";
      writer.IncrementIdentLevel();
      writer += "comp > 0 -> span = middle";
      writer += "comp < 0 -> {";
      writer.IncrementIdentLevel();
      writer += "middle++";
      writer += "start += middle";
      writer += "span -= middle";
      writer.DecrementIdentLevel();
      writer += "}";  // end comp < 0
      writer += "else -> {";
      writer.IncrementIdentLevel();
      writer += "return (obj ?: {{struct_name}}()).init(tableOffset, bb)";
      writer.DecrementIdentLevel();
      writer += "}";  // end else
      writer.DecrementIdentLevel();
      writer += "}";  // end when
      writer.DecrementIdentLevel();
      writer += "}";  // end while
      writer += "return null";
    };
    GenerateFun(writer, "lookupByKey", params.str(),
                namer_.Type(struct_def) + "?", statements,
                options.gen_jvmstatic);
  }